

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.hpp
# Opt level: O1

result_type __thiscall
trng::correlated_normal_dist<double>::operator()(correlated_normal_dist<double> *this,lcg64 *r)

{
  iterator __position;
  pointer pdVar1;
  pointer pdVar2;
  ulong uVar3;
  long lVar4;
  size_type sVar5;
  result_type rVar6;
  double local_10;
  
  uVar3 = (r->S).r * (r->P).a + (r->P).b;
  (r->S).r = uVar3;
  local_10 = math::detail::inv_Phi<double>
                       ((double)(uVar3 >> 1) * 1.084202172485504e-19 + 2.220446049250313e-16);
  __position._M_current =
       (this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->normal_,__position,&local_10);
  }
  else {
    *__position._M_current = local_10;
    (this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  pdVar1 = (this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = (long)pdVar2 - (long)pdVar1;
  sVar5 = lVar4 >> 3;
  if (lVar4 == 0) {
    rVar6 = 0.0;
  }
  else {
    rVar6 = 0.0;
    lVar4 = 0;
    do {
      rVar6 = rVar6 + (this->P).H_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[(sVar5 - 1) * (this->P).d_ + lVar4] *
                      pdVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (sVar5 + (sVar5 == 0) != lVar4);
  }
  if ((pdVar2 != pdVar1) && (sVar5 == (this->P).d_)) {
    (this->normal_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  return rVar6;
}

Assistant:

result_type operator()(R &r) {
      normal_.push_back(trng::math::inv_Phi(utility::uniformoo<result_type>(r)));
      result_type y{P.H_times(normal_)};
      if (normal_.size() == P.d())
        normal_.clear();
      return y;
    }